

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perlin.h
# Opt level: O3

void __thiscall perlin::perlin(perlin *this)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  vec3 *pvVar5;
  int *piVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  pvVar5 = (vec3 *)operator_new__(0x1800);
  memset(pvVar5,0,0x1800);
  this->ranvec = pvVar5;
  lVar7 = 0x10;
  do {
    iVar2 = rand();
    iVar3 = rand();
    iVar4 = rand();
    dVar9 = (double)iVar2 * 4.656612873077393e-10 + (double)iVar2 * 4.656612873077393e-10 + -1.0;
    dVar10 = (double)iVar3 * 4.656612873077393e-10 + (double)iVar3 * 4.656612873077393e-10 + -1.0;
    dVar8 = (double)iVar4 * 4.656612873077393e-10 + (double)iVar4 * 4.656612873077393e-10 + -1.0;
    pvVar5 = this->ranvec;
    dVar11 = 1.0 / SQRT(dVar8 * dVar8 + dVar9 * dVar9 + dVar10 * dVar10);
    pdVar1 = (double *)((long)pvVar5->e + lVar7 + -0x10);
    *pdVar1 = dVar11 * dVar9;
    pdVar1[1] = dVar11 * dVar10;
    *(double *)((long)pvVar5->e + lVar7) = dVar8 * dVar11;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x1810);
  piVar6 = perlin_generate_perm();
  this->perm_x = piVar6;
  piVar6 = perlin_generate_perm();
  this->perm_y = piVar6;
  piVar6 = perlin_generate_perm();
  this->perm_z = piVar6;
  return;
}

Assistant:

perlin() {
        ranvec = new vec3[point_count];
        for (int i = 0; i < point_count; ++i) {
            ranvec[i] = unit_vector(vec3::random(-1, 1));
        }

        perm_x = perlin_generate_perm();
        perm_y = perlin_generate_perm();
        perm_z = perlin_generate_perm();
    }